

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valtype.h
# Opt level: O0

bool __thiscall wasm::analysis::ValType::meet(ValType *this,Element *meetee,Element meeter)

{
  bool bVar1;
  bool local_49;
  Type local_38;
  Type glb;
  Element *meetee_local;
  ValType *this_local;
  Element meeter_local;
  
  this_local = (ValType *)meeter.id;
  bVar1 = Type::operator==(meetee,(Type *)&this_local);
  local_49 = true;
  if (!bVar1) {
    glb.id._4_4_ = 0;
    local_49 = Type::operator==((Type *)&this_local,(BasicType *)((long)&glb.id + 4));
  }
  if (local_49 == false) {
    glb.id._0_4_ = 0;
    bVar1 = Type::operator==(meetee,(BasicType *)&glb);
    if (bVar1) {
      meetee->id = (uintptr_t)this_local;
      meeter_local.id._7_1_ = true;
    }
    else {
      local_38.id = wasm::Type::getGreatestLowerBound(meetee->id,(Type)this_local);
      bVar1 = Type::operator!=(&local_38,meetee);
      if (bVar1) {
        meetee->id = local_38.id;
        meeter_local.id._7_1_ = true;
      }
      else {
        meeter_local.id._7_1_ = false;
      }
    }
  }
  else {
    meeter_local.id._7_1_ = false;
  }
  return meeter_local.id._7_1_;
}

Assistant:

bool meet(Element& meetee, Element meeter) const noexcept {
    if (meetee == meeter || meeter == Type::none) {
      return false;
    }
    if (meetee == Type::none) {
      meetee = meeter;
      return true;
    }
    auto glb = Type::getGreatestLowerBound(meetee, meeter);
    if (glb != meetee) {
      meetee = glb;
      return true;
    }
    return false;
  }